

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.cpp
# Opt level: O3

Error * ot::commissioner::RestoreFilePath(Error *__return_storage_ptr__,string *aPath)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  undefined4 uVar3;
  string dirName;
  Error error;
  string baseName;
  undefined1 local_100 [8];
  _Alloc_hider local_f8;
  char local_f0 [8];
  char local_e8 [16];
  string local_d8;
  ErrorCode local_b8;
  char *local_b0;
  size_type local_a8;
  char local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = kNone;
  local_a8 = 0;
  local_a0 = '\0';
  pcVar2 = (aPath->_M_dataplus)._M_p;
  local_b0 = &local_a0;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + aPath->_M_string_length);
  PathExists((Error *)local_100,&local_50);
  uVar3 = local_100._0_4_;
  if (local_f8._M_p != local_e8) {
    operator_delete(local_f8._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (uVar3 == kNone) {
    __return_storage_ptr__->mCode = kNone;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_string_length = 0;
    (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
    goto LAB_00271ddf;
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  SplitPath(aPath,&local_d8,&local_90);
  if (local_d8._M_string_length == 0) {
LAB_00271d33:
    local_100 = (undefined1  [8])local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_100,"");
    WriteFile(__return_storage_ptr__,(string *)local_100,aPath);
    if (local_100 != (undefined1  [8])local_f0) {
      operator_delete((void *)local_100);
    }
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,local_d8._M_dataplus._M_p,
               local_d8._M_dataplus._M_p + local_d8._M_string_length);
    PathExists((Error *)local_100,&local_70);
    uVar3 = local_100._0_4_;
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (uVar3 == kNone) goto LAB_00271d33;
    RestoreDirPath((Error *)local_100,&local_d8);
    local_b8 = local_100._0_4_;
    std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_f8);
    if (local_f8._M_p != local_e8) {
      operator_delete(local_f8._M_p);
    }
    if (local_b8 == kNone) goto LAB_00271d33;
    __return_storage_ptr__->mCode = local_b8;
    paVar1 = &(__return_storage_ptr__->mMessage).field_2;
    (__return_storage_ptr__->mMessage)._M_dataplus._M_p = (pointer)paVar1;
    if (local_b0 == &local_a0) {
      paVar1->_M_allocated_capacity = CONCAT71(uStack_9f,local_a0);
      *(undefined8 *)((long)&(__return_storage_ptr__->mMessage).field_2 + 8) = uStack_98;
    }
    else {
      (__return_storage_ptr__->mMessage)._M_dataplus._M_p = local_b0;
      (__return_storage_ptr__->mMessage).field_2._M_allocated_capacity =
           CONCAT71(uStack_9f,local_a0);
    }
    (__return_storage_ptr__->mMessage)._M_string_length = local_a8;
    local_a8 = 0;
    local_a0 = '\0';
    local_b0 = &local_a0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
LAB_00271ddf:
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

Error RestoreFilePath(const std::string &aPath)
{
    Error error;
    if (PathExists(aPath).GetCode() != ErrorCode::kNone)
    {
        std::string dirName, baseName;
        SplitPath(aPath, dirName, baseName);

        if (!dirName.empty() && (PathExists(dirName).GetCode() != ErrorCode::kNone))
        {
            error = RestoreDirPath(dirName);
            if (error != ERROR_NONE)
            {
                return error;
            }
        }

        // Attempt to create empty file
        return WriteFile("", aPath);
    }

    return ERROR_NONE;
}